

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

iterator __thiscall QList<unsigned_long_long>::end(QList<unsigned_long_long> *this)

{
  unsigned_long_long *n;
  QArrayDataPointer<unsigned_long_long> *in_RDI;
  long in_FS_OFFSET;
  QArrayDataPointer<unsigned_long_long> *in_stack_ffffffffffffffe0;
  iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  detach((QList<unsigned_long_long> *)0x37d5e9);
  QArrayDataPointer<unsigned_long_long>::operator->(in_RDI);
  n = QArrayDataPointer<unsigned_long_long>::end(in_stack_ffffffffffffffe0);
  iterator::iterator(&local_10,n);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (iterator)local_10.i;
  }
  __stack_chk_fail();
}

Assistant:

iterator end() { detach(); return iterator(d->end()); }